

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O3

void Ssw_RarSetDefaultParams(Ssw_RarPars_t *p)

{
  p->pCex = (Abc_Cex_t *)0x0;
  p->pFuncOnFail = (_func_int_int_Abc_Cex_t_ptr *)0x0;
  p->fLatchOnly = 0;
  p->fUseFfGrouping = 0;
  *(undefined8 *)&p->nSolved = 0;
  p->fSilent = 0;
  p->fDropSatOuts = 0;
  p->fMiter = 0;
  p->fUseCex = 0;
  p->nFrames = 0x14;
  p->nWords = 0x32;
  p->nBinSize = 8;
  p->nRounds = 0;
  p->nRestart = 0;
  p->nRandSeed = 0;
  p->TimeOut = 0;
  p->TimeOutGap = 0;
  p->fSolveAll = 0;
  p->fSetLastState = 0;
  p->fVerbose = 0;
  p->fNotVerbose = 0;
  return;
}

Assistant:

void Ssw_RarSetDefaultParams( Ssw_RarPars_t * p )
{
    memset( p, 0, sizeof(Ssw_RarPars_t) );
    p->nFrames       =  20;
    p->nWords        =  50;
    p->nBinSize      =   8;
    p->nRounds       =   0;
    p->nRestart      =   0;
    p->nRandSeed     =   0;
    p->TimeOut       =   0;
    p->TimeOutGap    =   0;
    p->fSolveAll     =   0;
    p->fDropSatOuts  =   0;
    p->fSetLastState =   0;
    p->fVerbose      =   0;
    p->fNotVerbose   =   0;
}